

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  fp y;
  fp x;
  fp x_00;
  float_specs specs_00;
  float_specs specs_01;
  float_specs specs_02;
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong divisor;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar5;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  fp fVar6;
  fp fVar7;
  fp value_00;
  double unaff_retaddr;
  result result_1;
  grisu_shortest_handler handler_1;
  fp cached_pow_1;
  boundaries boundaries;
  fp fp_value;
  int num_digits;
  fixed_handler handler;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  int exp;
  bool fixed;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  char digit_3;
  uint64_t remainder_1;
  anon_class_16_2_fdf32556 divmod_integral_1;
  uint32_t digit_2;
  result result_2;
  uint64_t fractional_1;
  uint32_t integral_1;
  fp one_1;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  buffer<char> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  uint64_t in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  fixed_handler *in_stack_fffffffffffffd18;
  uint64_t in_stack_fffffffffffffd20;
  fixed_handler *in_stack_fffffffffffffd28;
  int local_2d0;
  char in_stack_fffffffffffffd37;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  fp *in_stack_fffffffffffffd40;
  double in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  buffer<char> *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  boundaries local_210;
  fp local_200;
  int local_1ec;
  undefined8 local_1e8;
  significand_type local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  byte local_1bc;
  significand_type local_1b8;
  int local_1b0;
  significand_type local_1a8;
  undefined8 uStack_1a0;
  significand_type local_198;
  undefined8 uStack_190;
  significand_type local_188;
  int local_180;
  significand_type local_178;
  int local_170;
  significand_type local_168;
  int iStack_160;
  undefined4 uStack_15c;
  significand_type local_158;
  int local_150;
  internal *local_148;
  uint local_140;
  significand_type local_138;
  int iStack_130;
  undefined4 uStack_12c;
  int local_120;
  undefined4 local_11c;
  int local_118 [3];
  undefined1 local_10b;
  undefined1 local_10a;
  byte local_109;
  buffer<char> *local_108;
  int local_fc;
  undefined8 local_f0;
  int local_e8;
  char local_e1;
  long local_e0;
  anon_class_16_2_fdf32556 local_d8;
  uint32_t local_c8;
  result local_c4;
  ulong local_c0;
  uint32_t local_b4;
  fp local_b0;
  char **local_a0;
  int *local_98;
  long local_90;
  significand_type local_88;
  int local_80;
  result local_78;
  char local_71;
  long local_70;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  uint32_t local_44;
  fp local_40;
  grisu_shortest_handler *local_30;
  int *local_28;
  long local_20;
  fixed_handler *local_18;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  
  local_109 = (char)((ulong)in_RSI >> 0x20) == '\x02';
  local_108 = in_RDX;
  local_fc = in_EDI;
  if (0.0 < (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
    iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    if (((uint)((ulong)in_RSI >> 0x34) & 1) == 0) {
      specs_00._4_4_ = in_stack_fffffffffffffda0;
      specs_00.precision = in_stack_fffffffffffffd9c;
      local_e8 = snprintf_float<double>
                           ((double)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                            iVar1,specs_00,in_stack_fffffffffffffd80);
    }
    else {
      local_118[0] = 0;
      local_11c = 0xffffffc4;
      local_120 = 0;
      local_f0 = in_RSI;
      if (in_EDI == -1) {
        fp::fp(&local_200);
        if ((local_f0._4_4_ >> 0x13 & 1) == 0) {
          local_210 = fp::assign_with_boundaries<double>
                                (in_stack_fffffffffffffd40,
                                 (double)CONCAT44(in_stack_fffffffffffffd3c,
                                                  in_stack_fffffffffffffd38));
          uVar3 = local_210.upper;
        }
        else {
          local_210 = fp::assign_float_with_boundaries<double>
                                ((fp *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                                 ,in_stack_fffffffffffffd58);
          uVar3 = local_210.upper;
        }
        fVar7._8_8_ = uVar3;
        fVar7.f = (ulong)(uint)local_200.e;
        fVar6 = normalize<0>((internal *)local_200.f,fVar7);
        local_200.f = fVar6.f;
        local_200.e = fVar6.e;
        fVar7 = get_cached_power(in_stack_fffffffffffffd04,
                                 (int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
        x_00.f._4_4_ = in_stack_fffffffffffffcfc;
        x_00.f._0_4_ = in_stack_fffffffffffffcf8;
        x_00.e = in_stack_fffffffffffffd00;
        x_00._12_4_ = in_stack_fffffffffffffd04;
        fVar6.f._4_4_ = in_stack_fffffffffffffcec;
        fVar6.f._0_4_ = in_stack_fffffffffffffce8;
        fVar6._8_8_ = in_stack_fffffffffffffcf0;
        fVar6 = operator*(x_00,fVar6);
        local_200.f = fVar6.f;
        local_200.e = fVar6.e;
        uVar3 = multiply(local_210.lower,fVar7.f);
        uVar4 = multiply(local_210.upper,fVar7.f);
        buffer<char>::data(local_108);
        fp::fp((fp *)&stack0xfffffffffffffd28,uVar4 + 1,local_200.e);
        local_20 = (uVar4 + 1) - (uVar3 - 1);
        local_28 = local_118;
        local_30 = (grisu_shortest_handler *)&stack0xfffffffffffffd40;
        local_18 = in_stack_fffffffffffffd28;
        fp::fp(&local_40,1L << (-(char)local_2d0 & 0x3fU),local_2d0);
        local_44 = (uint32_t)((ulong)local_18 >> (-(char)local_40.e & 0x3fU));
        local_50 = (ulong)local_18 & local_40.f - 1;
        iVar1 = count_digits(local_44);
        *local_28 = iVar1;
        local_54 = grisu_shortest_handler::on_start
                             (local_30,*(long *)(basic_data<void>::powers_of_10_64 +
                                                (long)(*local_28 + -1) * 8) <<
                                       (-(char)local_40.e & 0x3fU),(ulong)local_18 / 10,
                              local_20 * 10,local_28);
        if (local_54 == more) {
          do {
            local_54 = 0;
            local_58 = 0;
            local_68.digit = &local_58;
            local_68.integral = &local_44;
            switch(*local_28) {
            case 1:
              local_58 = local_44;
              local_44 = 0;
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,10);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,100);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,1000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,10000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,100000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,1000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,10000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,100000000);
              break;
            case 10:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_68,1000000000);
            }
            *local_28 = *local_28 + -1;
            local_70 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
            in_stack_fffffffffffffce8 = 1;
            local_54 = grisu_shortest_handler::on_digit
                                 ((grisu_shortest_handler *)
                                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                  in_stack_fffffffffffffd37,(uint64_t)in_stack_fffffffffffffd28,
                                  in_stack_fffffffffffffd20,(uint64_t)in_stack_fffffffffffffd18,
                                  in_stack_fffffffffffffd14,
                                  SUB41((uint)in_stack_fffffffffffffd10 >> 0x18,0));
            if (local_54 != more) goto LAB_00136f53;
          } while (0 < *local_28);
          do {
            local_54 = 0;
            local_20 = local_20 * 10;
            local_71 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
            local_50 = local_40.f - 1 & local_50 * 10;
            *local_28 = *local_28 + -1;
            in_stack_fffffffffffffce8 = 0;
            local_54 = grisu_shortest_handler::on_digit
                                 ((grisu_shortest_handler *)
                                  CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                  in_stack_fffffffffffffd37,(uint64_t)in_stack_fffffffffffffd28,
                                  in_stack_fffffffffffffd20,(uint64_t)in_stack_fffffffffffffd18,
                                  in_stack_fffffffffffffd14,
                                  SUB41((uint)in_stack_fffffffffffffd10 >> 0x18,0));
          } while (local_54 == more);
        }
LAB_00136f53:
        if (local_54 == error) {
          local_118[0] = (-1 - local_120) + local_118[0];
          fallback_format<double>
                    (unaff_retaddr,(buffer<char> *)CONCAT44(2,in_stack_fffffffffffffff8),
                     (int *)CONCAT44(in_stack_fffffffffffffff4,local_2d0));
          return local_118[0];
        }
        to_unsigned<int>(0);
        buffer<char>::resize
                  (in_stack_fffffffffffffcf0,
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      else {
        if (0x11 < in_EDI) {
          specs_01._4_4_ = in_stack_fffffffffffffda0;
          specs_01.precision = in_stack_fffffffffffffd9c;
          iVar1 = snprintf_float<double>
                            ((double)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             iVar1,specs_01,in_stack_fffffffffffffd80);
          return iVar1;
        }
        fp::fp<double>((fp *)in_stack_fffffffffffffcf0,
                       (double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        value_00.f = (ulong)local_140;
        value_00._8_8_ = extraout_RDX;
        fVar6 = normalize<0>(local_148,value_00);
        local_158 = fVar6.f;
        local_150 = fVar6.e;
        local_138 = local_158;
        iStack_130 = local_150;
        fVar6 = get_cached_power(in_stack_fffffffffffffd04,
                                 (int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
        local_1a8 = fVar6.f;
        local_170 = fVar6.e;
        uStack_190 = CONCAT44(uStack_12c,iStack_130);
        local_198 = local_138;
        uStack_1a0 = CONCAT44(uStack_15c,local_170);
        x.f._4_4_ = in_stack_fffffffffffffcfc;
        x.f._0_4_ = in_stack_fffffffffffffcf8;
        x.e = in_stack_fffffffffffffd00;
        x._12_4_ = in_stack_fffffffffffffd04;
        y.f._4_4_ = in_stack_fffffffffffffcec;
        y.f._0_4_ = in_stack_fffffffffffffce8;
        y._8_8_ = in_stack_fffffffffffffcf0;
        local_178 = local_1a8;
        local_168 = local_1a8;
        iStack_160 = local_170;
        fVar6 = operator*(x,y);
        local_1b8 = fVar6.f;
        local_1b0 = fVar6.e;
        local_188 = local_1b8;
        local_180 = local_1b0;
        local_138 = local_1b8;
        iStack_130 = local_1b0;
        local_1d0 = buffer<char>::data(local_108);
        local_1c8 = 0;
        local_1c4 = local_fc;
        local_1c0 = -local_120;
        local_1bc = local_109 & 1;
        local_1e0 = local_138;
        local_1d8 = CONCAT44(uStack_12c,iStack_130);
        local_88 = local_138;
        local_80 = iStack_130;
        local_90 = 1;
        local_98 = local_118;
        local_a0 = &local_1d0;
        fp::fp(&local_b0,1L << (-(char)iStack_130 & 0x3fU),iStack_130);
        local_b4 = (uint32_t)(local_88 >> (-(char)local_b0.e & 0x3fU));
        local_c0 = local_88 & local_b0.f - 1;
        iVar1 = count_digits(local_b4);
        *local_98 = iVar1;
        local_78 = fixed_handler::on_start
                             (in_stack_fffffffffffffd18,
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              in_stack_fffffffffffffd08,
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
        if (local_78 == more) {
          do {
            local_c4 = 0;
            local_c8 = 0;
            local_d8.digit = &local_c8;
            local_d8.integral = &local_b4;
            divisor = (ulong)(*local_98 - 1);
            switch(divisor) {
            case 0:
              local_c8 = local_b4;
              local_b4 = 0;
              break;
            case 1:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,10);
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,100);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,1000);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,10000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,100000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,1000000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,10000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,100000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_d8,1000000000);
            }
            *local_98 = *local_98 + -1;
            local_e0 = ((ulong)local_b4 << (-(char)local_b0.e & 0x3fU)) + local_c0;
            in_stack_fffffffffffffce8 = 1;
            local_78 = fixed_handler::on_digit
                                 (in_stack_fffffffffffffd28,
                                  (char)(in_stack_fffffffffffffd20 >> 0x38),divisor,
                                  CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                  in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                                  SUB41((uint)in_stack_fffffffffffffd00 >> 0x18,0));
            iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
            if (local_78 != more) goto LAB_001367de;
          } while (0 < *local_98);
          do {
            local_c4 = 0;
            local_90 = local_90 * 10;
            local_e1 = (char)(local_c0 * 10 >> (-(char)local_b0.e & 0x3fU)) + '0';
            local_c0 = local_b0.f - 1 & local_c0 * 10;
            *local_98 = *local_98 + -1;
            in_stack_fffffffffffffce8 = 0;
            local_78 = fixed_handler::on_digit
                                 (in_stack_fffffffffffffd28,
                                  (char)(in_stack_fffffffffffffd20 >> 0x38),divisor,
                                  CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                  in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                                  SUB41((uint)in_stack_fffffffffffffd00 >> 0x18,0));
            iVar1 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
          } while (local_78 == more);
        }
LAB_001367de:
        local_c4 = local_78;
        if (local_78 == error) {
          local_1e8 = local_f0;
          specs_02._4_4_ = in_stack_fffffffffffffda0;
          specs_02.precision = in_stack_fffffffffffffd9c;
          iVar1 = snprintf_float<double>
                            ((double)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             iVar1,specs_02,in_stack_fffffffffffffd80);
          return iVar1;
        }
        local_1ec = local_1c8;
        if ((local_109 & 1) == 0) {
          while( true ) {
            bVar5 = false;
            if (0 < local_1ec) {
              pcVar2 = buffer<char>::operator[](local_108,(long)(local_1ec + -1));
              bVar5 = *pcVar2 == '0';
            }
            if (!bVar5) break;
            local_1ec = local_1ec + -1;
            local_118[0] = local_118[0] + 1;
          }
        }
        to_unsigned<int>(local_1ec);
        buffer<char>::resize
                  (in_stack_fffffffffffffcf0,
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      local_e8 = local_118[0] - local_120;
    }
  }
  else if ((in_EDI < 1) || (!(bool)local_109)) {
    local_10a = 0x30;
    buffer<char>::push_back
              (in_stack_fffffffffffffcf0,
               (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_e8 = 0;
  }
  else {
    to_unsigned<int>(in_EDI);
    buffer<char>::resize
              (in_stack_fffffffffffffcf0,
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    buffer<char>::data(local_108);
    local_10b = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,(char *)in_stack_fffffffffffffcf0);
    local_e8 = -local_fc;
  }
  return local_e8;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}